

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seat.hpp
# Opt level: O2

unique_ptr<seat,_std::default_delete<seat>_> __thiscall
seat::createSeat<Disabled>
          (seat *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *PriceMap)

{
  pointer *__ptr;
  undefined1 local_68 [88];
  
  Disabled::Disabled((Disabled *)(local_68 + 8),PriceMap);
  std::make_unique<Disabled,Disabled>((Disabled *)local_68);
  this->_vptr_seat = (_func_int **)local_68._0_8_;
  local_68._0_8_ = (_func_int **)0x0;
  ~seat((seat *)(local_68 + 8));
  return (__uniq_ptr_data<seat,_std::default_delete<seat>,_true,_true>)
         (__uniq_ptr_data<seat,_std::default_delete<seat>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<seat> createSeat(std::map<std::string, size_t> &PriceMap) // Produce new object of subclass
    {
        return std::make_unique<T>(T(PriceMap));
    }